

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_DecodeBase58Check_Test::~CryptoUtil_DecodeBase58Check_Test
          (CryptoUtil_DecodeBase58Check_Test *this)

{
  CryptoUtil_DecodeBase58Check_Test *this_local;
  
  ~CryptoUtil_DecodeBase58Check_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, DecodeBase58Check) {
  std::string data(
      "xpub6FZeZ5vwcYiT6r7ZYKJhyUqBxMBvzSmb6SpPQCsSenGPrVjKk5SGW4JJpc7cKERN8w9KnJZcMgJA4B2cHnpGq5TahYrDvZSBY2EMLKPRMTT");
  ByteData byte_data = CryptoUtil::DecodeBase58Check(data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "0488b21e051431616f00000000e6ba4088246b104837c62bd01fd8ba1cf2931ad1a5376c2360a1f112f2cfc63c02acf89ab4e3daa79bceef2ebecee2af92712e6bf5e4b0d10c74bbecc27ac13da8");
}